

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncDecVerify.cpp
# Opt level: O3

void incdec_verify::PreDecTestUint16(void)

{
  bool expected;
  unsigned_short t;
  long lVar1;
  string local_50;
  
  lVar1 = 4;
  do {
    t = *(unsigned_short *)(&UNK_0014d94c + lVar1);
    if (t == 0) {
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
    }
    expected = *(bool *)((long)&dec_uint16 + lVar1);
    if (((unsigned_short)(t - 1) == *(short *)(&UNK_0014d94e + lVar1)) != expected) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Error in case dec_uint16 throw (1): ","");
      err_msg<unsigned_short>(&local_50,t,expected);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    lVar1 = lVar1 + 6;
  } while (lVar1 != 0x3a);
  return;
}

Assistant:

void PreDecTestUint16()
{
	size_t i;

	for( i = 0; i < COUNTOF(dec_uint16); ++i )
	{
		bool fSuccess = true;
		try
		{
			SafeInt<std::uint16_t> si(dec_uint16[i].x);
			SafeInt<std::uint16_t> vv = --si;

			if(vv != dec_uint16[i].y)
			{
				fSuccess = false;
			}
		}
		catch(SafeIntException&)
		{
			fSuccess = false;
		}

		if( fSuccess != dec_uint16[i].fExpected )
		{
			err_msg( "Error in case dec_uint16 throw (1): ", dec_uint16[i].x, dec_uint16[i].fExpected );
		}
	}
}